

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS
ref_recon_kexact_gradient_hessian
          (REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *gradient,REF_DBL *hessian)

{
  double dVar1;
  uint uVar2;
  REF_NODE ref_node;
  long *plVar3;
  REF_CLOUD pRVar4;
  uint uVar5;
  int iVar6;
  uint m;
  REF_CLOUD *ppRVar7;
  REF_DBL *pRVar8;
  REF_DBL *r;
  REF_DBL *pRVar9;
  REF_DBL *pRVar10;
  double *pdVar11;
  undefined8 uVar12;
  ulong uVar13;
  size_t __size;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  REF_CELL pRVar18;
  long lVar19;
  uint uVar20;
  bool bVar21;
  REF_CLOUD ref_cloud;
  REF_DBL ab [90];
  double local_430;
  double local_428;
  uint local_41c;
  REF_CLOUD *local_418;
  REF_CELL local_410;
  ulong local_408;
  undefined8 local_400;
  REF_DBL *local_3f8;
  REF_CLOUD local_3f0;
  REF_DBL *local_3e8;
  REF_CLOUD local_3e0;
  REF_DBL local_3d8;
  double dStack_3d0;
  double local_3c8;
  double dStack_3c0;
  double local_3b8;
  double local_3b0;
  double dStack_3a8;
  double dStack_3a0;
  double dStack_398;
  REF_DBL *local_388;
  REF_GRID local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 *local_360;
  double *local_358;
  ulong local_350;
  double local_348;
  double dStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  double local_328;
  double dStack_320;
  double local_318;
  double local_310;
  REF_DBL local_308 [81];
  double local_80 [10];
  
  ref_node = ref_grid->node;
  if (ref_grid->twod == 0) {
    pRVar18 = ref_grid->cell[8];
  }
  else {
    pRVar18 = ref_grid->cell[3];
  }
  iVar6 = ref_node->max;
  uVar13 = (ulong)iVar6;
  if ((long)uVar13 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x3ca,
           "ref_recon_kexact_gradient_hessian","malloc one_layer of REF_CLOUD negative");
    uVar5 = 1;
  }
  else {
    local_3e8 = gradient;
    ppRVar7 = (REF_CLOUD *)malloc(uVar13 * 8);
    local_418 = ppRVar7;
    if (ppRVar7 == (REF_CLOUD *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x3ca
             ,"ref_recon_kexact_gradient_hessian","malloc one_layer of REF_CLOUD NULL");
      uVar5 = 2;
    }
    else {
      local_388 = hessian;
      if (iVar6 != 0) {
        lVar17 = 0;
        local_410 = pRVar18;
        memset(ppRVar7,0,uVar13 * 8);
        pRVar18 = local_410;
        do {
          if (-1 < ref_node->global[lVar17]) {
            uVar5 = ref_cloud_create(ppRVar7,4);
            if (uVar5 != 0) {
              pcVar16 = "cloud storage";
              uVar12 = 0x3cc;
              goto LAB_001e1072;
            }
            uVar13 = (ulong)(uint)ref_node->max;
          }
          lVar17 = lVar17 + 1;
          ppRVar7 = ppRVar7 + 1;
        } while (lVar17 < (int)uVar13);
      }
      ppRVar7 = local_418;
      uVar5 = ref_recon_local_immediate_cloud(local_418,ref_node,pRVar18,scalar);
      if (uVar5 == 0) {
        uVar5 = ref_recon_ghost_cloud(ppRVar7,ref_node);
        if (uVar5 == 0) {
          iVar6 = ref_node->max;
          pRVar8 = local_388;
          if (0 < iVar6) {
            local_350 = 0x7fffffff8;
            pRVar18 = (REF_CELL)0x0;
            local_380 = ref_grid;
            do {
              if ((-1 < ref_node->global[(long)pRVar18]) &&
                 (ref_node->ref_mpi->id == ref_node->part[(long)pRVar18])) {
                uVar5 = ref_cloud_deep_copy(&local_3e0,ppRVar7[(long)pRVar18]);
                if (uVar5 != 0) {
                  pcVar16 = "create ref_cloud";
                  uVar12 = 0x3d6;
                  goto LAB_001e1072;
                }
                local_358 = (double *)(((long)pRVar18 * 0x30 & 0x7fffffff0U) + (long)pRVar8);
                local_360 = (undefined8 *)(((long)pRVar18 * 0x18 & local_350) + (long)local_3e8);
                uVar20 = 2;
                local_410 = pRVar18;
LAB_001e115c:
                uVar5 = ref_recon_grow_cloud_one_layer(local_3e0,ppRVar7,ref_node);
                pRVar4 = local_3e0;
                if (uVar5 != 0) {
                  pcVar16 = "grow";
                  uVar12 = 0x3da;
                  goto LAB_001e1072;
                }
                lVar17 = -1;
                if (((long)local_410 < (long)ref_node->max) &&
                   (lVar17 = ref_node->global[(long)local_410], lVar17 < 0)) {
                  lVar17 = -1;
                }
                iVar6 = local_380->twod;
                local_348 = 0.0;
                dStack_340 = 0.0;
                local_338 = 0;
                uStack_330 = 0;
                uVar5 = ref_cloud_item(local_3e0,lVar17,(REF_INT *)&local_41c);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x1be,"ref_recon_kexact_with_aux",(ulong)uVar5,"missing center");
                  goto LAB_001e121f;
                }
                lVar19 = (long)pRVar4->naux;
                if (0 < lVar19) {
                  memcpy(&local_328,pRVar4->aux + (int)local_41c * lVar19,lVar19 * 8);
                }
                local_3f0 = pRVar4;
                uVar2 = pRVar4->n;
                m = (-(uint)(iVar6 == 0) | 3) + uVar2;
                uVar13 = (ulong)m;
                local_378 = 0;
                uStack_370 = 0;
                uVar5 = 4;
                local_400 = 0;
                if ((int)m < 9) {
LAB_001e1562:
                  local_430 = 0.0;
                  local_428 = 0.0;
                  ppRVar7 = local_418;
LAB_001e1573:
                  pcVar16 = "REF_DIV_ZERO";
                  if ((uVar5 == 4 && 4 < uVar20) ||
                     (pcVar16 = "REF_ILL_CONDITIONED", uVar5 == 8 && 4 < uVar20)) {
                    ref_node_location(ref_node,(REF_INT)local_410);
                    printf(" caught %s, for %d layers to kexact cloud; retry\n",pcVar16,
                           (ulong)uVar20);
                  }
                  if ((uVar5 == 0) || (bVar21 = 7 < uVar20, uVar20 = uVar20 + 1, bVar21))
                  goto LAB_001e1a9b;
                  goto LAB_001e115c;
                }
                __size = (ulong)(m * 9) << 3;
                pRVar8 = (REF_DBL *)malloc(__size);
                if (pRVar8 == (REF_DBL *)0x0) {
                  uVar12 = 0x1cb;
                  pcVar16 = "malloc a of REF_DBL NULL";
LAB_001e1552:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,uVar12,"ref_recon_kexact_with_aux",pcVar16);
                  uVar5 = 2;
                  goto LAB_001e1562;
                }
                local_3f8 = pRVar8;
                pRVar8 = (REF_DBL *)malloc(__size);
                if (pRVar8 == (REF_DBL *)0x0) {
                  uVar12 = 0x1cc;
                  pcVar16 = "malloc q of REF_DBL NULL";
                  goto LAB_001e1552;
                }
                r = (REF_DBL *)malloc(0x288);
                ppRVar7 = local_418;
                if (r == (REF_DBL *)0x0) {
                  uVar12 = 0x1cd;
                  pcVar16 = "malloc r of REF_DBL NULL";
                  goto LAB_001e1552;
                }
                if (iVar6 == 0) {
                  uVar5 = 0;
                }
                else {
                  local_3c8 = 0.0;
                  dStack_3c0 = 0.0;
                  local_3d8 = 0.0;
                  dStack_3d0 = 0.0;
                  local_3b8 = 0.0;
                  local_3b0 = 0.5;
                  dStack_3a8 = 0.0;
                  dStack_3a0 = 0.0;
                  dStack_398 = 1.0;
                  lVar14 = 0;
                  pRVar10 = local_3f8;
                  do {
                    *pRVar10 = (&local_3d8)[lVar14];
                    lVar14 = lVar14 + 1;
                    pRVar10 = pRVar10 + uVar13;
                  } while (lVar14 != 9);
                  local_3c8 = 0.0;
                  dStack_3c0 = 0.0;
                  local_3d8 = 0.0;
                  dStack_3d0 = 0.0;
                  local_3b8 = 0.0;
                  local_3b0 = 2.0;
                  dStack_3a8 = 0.0;
                  dStack_3a0 = 0.0;
                  dStack_398 = 2.0;
                  pRVar10 = local_3f8 + 1;
                  lVar14 = 0;
                  do {
                    *pRVar10 = (&local_3d8)[lVar14];
                    lVar14 = lVar14 + 1;
                    pRVar10 = pRVar10 + uVar13;
                  } while (lVar14 != 9);
                  local_3d8 = 0.5;
                  dStack_3d0 = 0.0;
                  local_3c8 = 1.0;
                  dStack_3c0 = 0.0;
                  local_3b8 = 0.0;
                  local_3b0 = 0.5;
                  dStack_3a8 = 1.0;
                  dStack_3a0 = 0.0;
                  dStack_398 = 1.0;
                  pRVar10 = local_3f8 + 2;
                  lVar14 = 0;
                  do {
                    *pRVar10 = (&local_3d8)[lVar14];
                    lVar14 = lVar14 + 1;
                    pRVar10 = pRVar10 + uVar13;
                  } while (lVar14 != 9);
                  local_3d8 = 0.0;
                  dStack_3d0 = 0.0;
                  local_3c8 = 0.0;
                  dStack_3c0 = 0.5;
                  local_3b8 = 1.0;
                  local_3b0 = 0.5;
                  dStack_3a8 = 0.0;
                  dStack_3a0 = 1.0;
                  dStack_398 = 1.0;
                  pRVar10 = local_3f8 + 3;
                  lVar14 = 0;
                  do {
                    *pRVar10 = (&local_3d8)[lVar14];
                    lVar14 = lVar14 + 1;
                    pRVar10 = pRVar10 + uVar13;
                  } while (lVar14 != 9);
                  uVar5 = 4;
                }
                local_41c = 0;
                if (0 < (int)uVar2) {
                  plVar3 = local_3f0->global;
                  lVar14 = *plVar3;
                  uVar15 = 0;
                  do {
                    if (lVar14 != lVar17) {
                      dStack_398 = local_3f0->aux[uVar15 * lVar19 + 2] - local_318;
                      pdVar11 = local_3f0->aux + uVar15 * lVar19;
                      dStack_3a8 = *pdVar11 - local_328;
                      dStack_3a0 = pdVar11[1] - dStack_320;
                      local_3d8 = dStack_3a8 * 0.5 * dStack_3a8;
                      dStack_3d0 = dStack_3a0 * dStack_3a8;
                      local_3c8 = dStack_398 * dStack_3a8;
                      dStack_3c0 = dStack_3a0 * 0.5 * dStack_3a0;
                      local_3b8 = dStack_3a0 * dStack_398;
                      local_3b0 = dStack_398 * 0.5 * dStack_398;
                      pRVar10 = local_3f8 + (int)uVar5;
                      lVar14 = 0;
                      do {
                        *pRVar10 = (&local_3d8)[lVar14];
                        lVar14 = lVar14 + 1;
                        pRVar10 = pRVar10 + uVar13;
                      } while (lVar14 != 9);
                      uVar5 = uVar5 + 1;
                    }
                    uVar15 = uVar15 + 1;
                    lVar14 = -1;
                    if (uVar15 < uVar2) {
                      lVar14 = plVar3[uVar15];
                    }
                    local_41c = uVar2;
                  } while (uVar15 != uVar2);
                }
                local_408 = uVar13;
                if (m != uVar5) {
                  uVar12 = 0x22e;
                  pcVar16 = "A row miscount";
LAB_001e1799:
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,uVar12,"ref_recon_kexact_with_aux",pcVar16,local_408,(long)(int)uVar5);
                  uVar5 = 1;
LAB_001e123f:
                  local_430 = 0.0;
                  local_428 = 0.0;
                  goto LAB_001e1573;
                }
                uVar5 = ref_matrix_qr(m,9,local_3f8,pRVar8,r);
                if (uVar5 == 0) {
                  pRVar10 = local_308;
                  memset(pRVar10,0,0x2d0);
                  lVar19 = 0;
                  pRVar9 = r;
                  do {
                    lVar14 = 0;
                    do {
                      *(double *)((long)pRVar10 + lVar14) =
                           *(double *)((long)pRVar9 + lVar14) + *(double *)((long)pRVar10 + lVar14);
                      lVar14 = lVar14 + 0x48;
                    } while (lVar14 != 0x288);
                    lVar19 = lVar19 + 1;
                    pRVar10 = pRVar10 + 1;
                    pRVar9 = pRVar9 + 1;
                  } while (lVar19 != 9);
                  if (iVar6 == 0) {
                    uVar5 = 0;
                  }
                  else {
                    lVar19 = 0;
                    pRVar10 = pRVar8;
                    do {
                      local_80[lVar19] = *pRVar10 * 0.0 + local_80[lVar19];
                      lVar19 = lVar19 + 1;
                      pRVar10 = pRVar10 + local_408;
                    } while (lVar19 != 9);
                    pdVar11 = pRVar8 + 1;
                    lVar19 = 0;
                    do {
                      local_80[lVar19] = *pdVar11 * 0.0 + local_80[lVar19];
                      lVar19 = lVar19 + 1;
                      pdVar11 = pdVar11 + local_408;
                    } while (lVar19 != 9);
                    pdVar11 = pRVar8 + 2;
                    lVar19 = 0;
                    do {
                      local_80[lVar19] = *pdVar11 * 0.0 + local_80[lVar19];
                      lVar19 = lVar19 + 1;
                      pdVar11 = pdVar11 + local_408;
                    } while (lVar19 != 9);
                    pdVar11 = pRVar8 + 3;
                    lVar19 = 0;
                    do {
                      local_80[lVar19] = *pdVar11 * 0.0 + local_80[lVar19];
                      lVar19 = lVar19 + 1;
                      pdVar11 = pdVar11 + local_408;
                    } while (lVar19 != 9);
                    uVar5 = 4;
                  }
                  local_41c = 0;
                  uVar2 = local_3f0->n;
                  uVar13 = (ulong)(int)uVar2;
                  if (0 < (long)uVar13) {
                    plVar3 = local_3f0->global;
                    lVar19 = *plVar3;
                    uVar15 = 0;
                    do {
                      if (lVar19 != lVar17) {
                        dVar1 = local_3f0->aux[(long)(int)uVar15 * (long)local_3f0->naux + 3];
                        pdVar11 = pRVar8 + (int)uVar5;
                        lVar19 = 0;
                        do {
                          local_80[lVar19] = *pdVar11 * (dVar1 - local_310) + local_80[lVar19];
                          lVar19 = lVar19 + 1;
                          pdVar11 = pdVar11 + local_408;
                        } while (lVar19 != 9);
                        uVar5 = uVar5 + 1;
                      }
                      uVar15 = uVar15 + 1;
                      lVar19 = -1;
                      if (uVar15 < uVar13) {
                        lVar19 = plVar3[uVar15];
                      }
                      local_41c = uVar2;
                    } while (uVar15 != uVar13);
                  }
                  if (m != uVar5) {
                    uVar12 = 0x256;
                    pcVar16 = "b row miscount";
                    goto LAB_001e1799;
                  }
                  uVar5 = ref_matrix_solve_ab(9,10,local_308);
                  if (uVar5 != 0) goto LAB_001e121f;
                  local_348 = local_80[0];
                  dStack_340 = local_80[1];
                  local_430 = local_80[2];
                  local_428 = local_80[3];
                  local_378 = local_80[4];
                  uStack_370 = local_80[5];
                  local_338 = local_80[6];
                  uStack_330 = local_80[7];
                  local_400 = local_80[8];
                  free(r);
                  free(pRVar8);
                  free(local_3f8);
                  uVar5 = 0;
                  goto LAB_001e1573;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x22f,"ref_recon_kexact_with_aux",(ulong)uVar5,"kexact lsq hess qr");
LAB_001e121f:
                if (uVar5 != 5) {
                  local_378 = 0;
                  uStack_370 = 0;
                  local_400 = 0;
                  goto LAB_001e123f;
                }
                ref_node_location(ref_node,(REF_INT)local_410);
                printf(" caught %s, for %d layers to kexact cloud; zero gradient and hessian\n",
                       "REF_NOT_FOUND",(ulong)uVar20);
                local_378 = 0;
                uStack_370 = 0;
                local_400 = 0;
                local_430 = 0.0;
                local_428 = 0.0;
LAB_001e1a9b:
                pRVar8 = local_388;
                if (local_3e8 != (REF_DBL *)0x0) {
                  if (local_380->twod != 0) {
                    local_400 = 0;
                  }
                  *local_360 = local_338;
                  local_360[1] = uStack_330;
                  local_360[2] = local_400;
                }
                if (local_388 != (REF_DBL *)0x0) {
                  bVar21 = local_380->twod == 0;
                  if (!bVar21) {
                    local_430 = 0.0;
                  }
                  *local_358 = local_348;
                  local_358[1] = dStack_340;
                  local_358[2] = local_430;
                  local_358[3] = local_428;
                  uVar5 = (uint)bVar21;
                  *(uint *)(local_358 + 4) = (int)(uVar5 << 0x1f) >> 0x1f & (uint)local_378;
                  *(uint *)((long)local_358 + 0x24) = (int)(uVar5 << 0x1f) >> 0x1f & local_378._4_4_
                  ;
                  *(uint *)(local_358 + 5) = (int)(uVar5 << 0x1f) >> 0x1f & (uint)uStack_370;
                  *(uint *)((long)local_358 + 0x2c) =
                       (int)(uVar5 << 0x1f) >> 0x1f & uStack_370._4_4_;
                }
                uVar5 = ref_cloud_free(local_3e0);
                if (uVar5 != 0) {
                  pcVar16 = "free ref_cloud";
                  uVar12 = 0x404;
                  goto LAB_001e1072;
                }
                iVar6 = ref_node->max;
                pRVar18 = local_410;
              }
              pRVar18 = (REF_CELL)((long)&pRVar18->type + 1);
            } while ((long)pRVar18 < (long)iVar6);
            if (0 < iVar6) {
              lVar17 = 0;
              do {
                if (-1 < ref_node->global[lVar17]) {
                  ref_cloud_free(ppRVar7[lVar17]);
                  iVar6 = ref_node->max;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < iVar6);
            }
          }
          free(ppRVar7);
          if ((local_3e8 == (REF_DBL *)0x0) ||
             (uVar5 = ref_node_ghost_dbl(ref_node,local_3e8,3), uVar5 == 0)) {
            if (pRVar8 == (REF_DBL *)0x0) {
              return 0;
            }
            uVar5 = ref_node_ghost_dbl(ref_node,pRVar8,6);
            if (uVar5 == 0) {
              return 0;
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x412,"ref_recon_kexact_gradient_hessian",(ulong)uVar5,"update ghosts");
            return uVar5;
          }
          pcVar16 = "update ghosts";
          uVar12 = 0x40e;
        }
        else {
          pcVar16 = "fill ghosts";
          uVar12 = 0x3d1;
        }
      }
      else {
        pcVar16 = "fill immediate cloud";
        uVar12 = 0x3d0;
      }
LAB_001e1072:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
             uVar12,"ref_recon_kexact_gradient_hessian",(ulong)uVar5,pcVar16);
    }
  }
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_kexact_gradient_hessian(REF_GRID ref_grid,
                                                            REF_DBL *scalar,
                                                            REF_DBL *gradient,
                                                            REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT node, im;
  REF_CLOUD ref_cloud;
  REF_DBL node_gradient[3], node_hessian[6];
  REF_STATUS status;
  REF_CLOUD *one_layer;
  REF_INT layer;

  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
  }

  RSS(ref_recon_local_immediate_cloud(one_layer, ref_node, ref_cell, scalar),
      "fill immediate cloud");
  RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      /* use ref_cloud to get a unique list of halo(2) nodes */
      RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]), "create ref_cloud");
      status = REF_INVALID;
      for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
        RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
            "grow");
        status = ref_recon_kexact_with_aux(ref_node_global(ref_node, node),
                                           ref_cloud, ref_grid_twod(ref_grid),
                                           node_gradient, node_hessian);
        if (REF_NOT_FOUND == status) {
          ref_node_location(ref_node, node);
          printf(
              " caught %s, for %d layers to kexact cloud; "
              "zero gradient and hessian\n",
              "REF_NOT_FOUND", layer);
          status = REF_SUCCESS;
          break;
        }
        if (REF_DIV_ZERO == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_DIV_ZERO", layer);
        }
        if (REF_ILL_CONDITIONED == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_ILL_CONDITIONED", layer);
        }
      }
      if (NULL != gradient) {
        if (ref_grid_twod(ref_grid)) {
          node_gradient[2] = 0.0;
        }
        for (im = 0; im < 3; im++) {
          gradient[im + 3 * node] = node_gradient[im];
        }
      }
      if (NULL != hessian) {
        if (ref_grid_twod(ref_grid)) {
          node_hessian[2] = 0.0;
          node_hessian[4] = 0.0;
          node_hessian[5] = 0.0;
        }
        for (im = 0; im < 6; im++) {
          hessian[im + 6 * node] = node_hessian[im];
        }
      }
      RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    ref_cloud_free(one_layer[node]); /* no-op for null */
  }
  ref_free(one_layer);

  if (NULL != gradient) {
    RSS(ref_node_ghost_dbl(ref_node, gradient, 3), "update ghosts");
  }

  if (NULL != hessian) {
    RSS(ref_node_ghost_dbl(ref_node, hessian, 6), "update ghosts");
  }

  return REF_SUCCESS;
}